

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall
Assimp::ASE::Parser::ParseLV3MeshCListBlock(Parser *this,uint iNumVertices,Mesh *mesh)

{
  bool bVar1;
  reference pvVar2;
  uint local_38;
  undefined1 auStack_34 [4];
  uint iIndex;
  aiColor4D vTemp;
  int iDepth;
  Mesh *mesh_local;
  uint iNumVertices_local;
  Parser *this_local;
  
  vTemp.b = 0.0;
  unique0x100001bb = mesh;
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize
            (&mesh->mVertexColors,(ulong)iNumVertices);
  do {
    while (*this->filePtr != '*') {
LAB_006307ff:
      if (*this->filePtr == '{') {
        vTemp.b = (float)((int)vTemp.b + 1);
      }
      else if (*this->filePtr == '}') {
        vTemp.b = (float)((int)vTemp.b + -1);
        if (vTemp.b == 0.0) {
          this->filePtr = this->filePtr + 1;
          SkipToNextToken(this);
          return;
        }
      }
      else if (*this->filePtr == '\0') {
        LogError(this,
                 "Encountered unexpected EOL while parsing a *MESH_CVERTEX_LIST chunk (Level 3)");
      }
      bVar1 = IsLineEnd<char>(*this->filePtr);
      if ((bVar1) && ((this->bLastWasEndLine & 1U) == 0)) {
        this->iLineNumber = this->iLineNumber + 1;
        this->bLastWasEndLine = true;
      }
      else {
        this->bLastWasEndLine = false;
      }
      this->filePtr = this->filePtr + 1;
    }
    this->filePtr = this->filePtr + 1;
    bVar1 = TokenMatch<char_const>(&this->filePtr,"MESH_VERTCOL",0xc);
    if (!bVar1) goto LAB_006307ff;
    aiColor4t<float>::aiColor4t((aiColor4t<float> *)auStack_34);
    vTemp.g = 1.0;
    ParseLV4MeshFloatTriple(this,(ai_real *)auStack_34,&local_38);
    if (local_38 < iNumVertices) {
      pvVar2 = std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::operator[]
                         (&stack0xffffffffffffffe0->mVertexColors,(ulong)local_38);
      pvVar2->r = (float)auStack_34;
      pvVar2->g = (float)iIndex;
      pvVar2->b = vTemp.r;
      pvVar2->a = vTemp.g;
    }
    else {
      LogWarning(this,"Vertex color has an invalid index. It will be ignored");
    }
  } while( true );
}

Assistant:

void Parser::ParseLV3MeshCListBlock(unsigned int iNumVertices, ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();

    // allocate enough storage in the array
    mesh.mVertexColors.resize(iNumVertices);
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Vertex entry
            if (TokenMatch(filePtr,"MESH_VERTCOL" ,12))
            {
                aiColor4D vTemp;
                vTemp.a = 1.0f;
                unsigned int iIndex;
                ParseLV4MeshFloatTriple(&vTemp.r,iIndex);

                if (iIndex >= iNumVertices)
                {
                    LogWarning("Vertex color has an invalid index. It will be ignored");
                }
                else mesh.mVertexColors[iIndex] = vTemp;
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_CVERTEX_LIST");
    }
    return;
}